

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::timeFormat(QString *__return_storage_ptr__,QLocale *this,FormatType format)

{
  QLocaleData *pQVar1;
  bool bVar2;
  QSystemLocale *pQVar3;
  ulong size;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    local_50 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_48,pQVar3,(ulong)(10 - (format == LongFormat)));
    ::QVariant::~QVariant((QVariant *)&local_68);
    bVar2 = ::QVariant::isNull((QVariant *)&local_48);
    if (bVar2) {
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    else {
      ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_48);
      ::QVariant::~QVariant((QVariant *)&local_48);
      if (!bVar2) goto LAB_00312f6d;
    }
  }
  pQVar1 = ((this->d).d.ptr)->m_data;
  size = (ulong)(byte)pQVar1->m_currency_iso_code[((ulong)(format == LongFormat) ^ 99) - 0x75];
  if (size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L"HH:mm:ss tHH:mm:ss tttth:mm:ss\x202fAp tttth:mm\x202fAph:mm:ss\x202fAp, tttth:mm:ss Ap tttth:mm ApAp h.mm.ss ttttHH:mm:ss (tttt)HH:mm:ss, ttttAp h:mm:ss ttttAp नि h:mmH:mm:ss \'ч\'. tttttttt HH:mm:ssAph:mm:ss [tttt]HH:mm:ss [tttt]tttt Aph:mm:ssHH.mm.ss ttttཆུ་ཚོད་ h སྐར་མ་ mm:ss Ap ttttཆུ་ཚོད་ h སྐར་མ་ mm ApAp \'ga\' h:mm:ss ttttH \'h\' mm \'min\' ss \'s\' ttttHH \'h\' mm \'min\' ss \'s\' ttttHH.mm:ss \'h\' tttthh:mm:ss Ap tttthh:mm ApH時mm分ss秒 ttttAp\x202fh:mm:ss\x202fttttAp h시 m분 s초 ttttH ໂມງ m ນາທີ ss ວິນາທີ tttt\'Klock\' H.mm:ss (tttt)\'Kl\'. H.mmh.mm.ss Ap tttth.mm. Ap\'kl\'. HH:mm:ss tttttttt h:mm:ss\x202fApH\'h\'mmH นาฬิกา mm นาที ss วินาที tttthh:mm:ss\x202fAp tttthh:mm\x202fApH:mm \'hodź\'."
                        + *(ushort *)
                           (pQVar1->m_currency_iso_code + (ulong)(format != LongFormat) * 2 + -0x4b)
                        ),size);
  }
LAB_00312f6d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::timeFormat(FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::TimeFormatLong
                                             : QSystemLocale::TimeFormatShort,
                                             QVariant());
        if (!res.isNull())
            return res.toString();
    }
#endif

    return (format == LongFormat
            ? d->m_data->longTimeFormat()
            : d->m_data->shortTimeFormat()
           ).getData(time_format_data);
}